

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::tdefl_output_buffer_putter(void *pBuf,int len,void *pUser)

{
  ulong uVar1;
  void *pvVar2;
  ulong *in_RDX;
  int in_ESI;
  void *in_RDI;
  mz_uint8 *pNew_buf;
  size_t new_capacity;
  size_t new_size;
  tdefl_output_buffer *p;
  ulong local_48;
  ulong local_38;
  
  uVar1 = *in_RDX + (long)in_ESI;
  if (in_RDX[1] < uVar1) {
    local_38 = in_RDX[1];
    if ((int)in_RDX[3] == 0) {
      return 0;
    }
    do {
      if (local_38 * 2 < 0x80) {
        local_48 = 0x80;
      }
      else {
        local_48 = local_38 << 1;
      }
      local_38 = local_48;
    } while (local_48 < uVar1);
    pvVar2 = realloc((void *)in_RDX[2],local_48);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    in_RDX[2] = (ulong)pvVar2;
    in_RDX[1] = local_48;
  }
  memcpy((void *)(in_RDX[2] + *in_RDX),in_RDI,(long)in_ESI);
  *in_RDX = uVar1;
  return 1;
}

Assistant:

static mz_bool tdefl_output_buffer_putter(const void *pBuf, int len,
                                          void *pUser) {
  tdefl_output_buffer *p = (tdefl_output_buffer *)pUser;
  size_t new_size = p->m_size + len;
  if (new_size > p->m_capacity) {
    size_t new_capacity = p->m_capacity;
    mz_uint8 *pNew_buf;
    if (!p->m_expandable)
      return MZ_FALSE;
    do {
      new_capacity = MZ_MAX(128U, new_capacity << 1U);
    } while (new_size > new_capacity);
    pNew_buf = (mz_uint8 *)MZ_REALLOC(p->m_pBuf, new_capacity);
    if (!pNew_buf)
      return MZ_FALSE;
    p->m_pBuf = pNew_buf;
    p->m_capacity = new_capacity;
  }
  memcpy((mz_uint8 *)p->m_pBuf + p->m_size, pBuf, len);
  p->m_size = new_size;
  return MZ_TRUE;
}